

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask6_24(uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long in_RAX;
  long unaff_RBX;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  vpmovsxbd_avx(ZEXT416(0x543c2814));
  uVar2 = in[0x16];
  uVar3 = in[0x17];
  auVar4 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + in_RAX));
  vpmovsxbd_avx(ZEXT416(0x442c1804));
  auVar7 = vpshufd_avx(auVar4,0x50);
  auVar7 = vpsrlvd_avx2(auVar7,_DAT_0019d220);
  puVar1 = out + 5;
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  auVar5 = vpsllvd_avx2(auVar5,_DAT_001942d0);
  auVar7 = vpblendd_avx2(auVar7,ZEXT416(*in),1);
  auVar7 = vpinsrd_avx(auVar7,in[0x10],3);
  auVar7 = vpor_avx(auVar5,auVar7);
  vpmovsxbd_avx(ZEXT416(0x48301c08));
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + unaff_RBX));
  auVar5 = vpsllvd_avx2(auVar5,_DAT_00191ad0);
  vpmovsxbd_avx(ZEXT416(0x4c34200c));
  auVar6 = vpgatherdd_avx512vl(*in);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_00191af0);
  auVar6 = vpternlogd_avx512vl(auVar6,auVar5,auVar7,0xfe);
  vpmovsxbd_avx(ZEXT416(0x50382410));
  auVar7 = vpsllvd_avx2(auVar4,_DAT_00191b20);
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  auVar5 = vpsllvd_avx2(auVar5,_DAT_00191b10);
  auVar7 = vpternlogd_avx512vl(auVar7,auVar5,auVar6,0xfe);
  *(undefined1 (*) [16])out = auVar7;
  out[4] = uVar3 << 10 | uVar2 << 4 | auVar4._12_4_ >> 2;
  return puVar1;
}

Assistant:

uint32_t *__fastpackwithoutmask6_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (6 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (6 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (6 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 10;
  ++in;

  return out + 1;
}